

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderCommonFunctionTests::init
          (ShaderCommonFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  TestNode *pTVar1;
  ulong uVar2;
  DataType local_68;
  DataType local_64;
  ShaderType local_40;
  int shaderType;
  DataType uintType;
  DataType intType;
  int vecSize;
  TestCaseGroup *uintGroup;
  TestCaseGroup *intGroup;
  ShaderCommonFunctionTests *this_local;
  
  addFunctionCases<deqp::gles3::Functional::AbsCase>
            (&this->super_TestCaseGroup,"abs",true,true,false);
  addFunctionCases<deqp::gles3::Functional::SignCase>
            (&this->super_TestCaseGroup,"sign",true,true,false);
  addFunctionCases<deqp::gles3::Functional::FloorCase>
            (&this->super_TestCaseGroup,"floor",true,false,false);
  addFunctionCases<deqp::gles3::Functional::TruncCase>
            (&this->super_TestCaseGroup,"trunc",true,false,false);
  addFunctionCases<deqp::gles3::Functional::RoundCase>
            (&this->super_TestCaseGroup,"round",true,false,false);
  addFunctionCases<deqp::gles3::Functional::RoundEvenCase>
            (&this->super_TestCaseGroup,"roundeven",true,false,false);
  addFunctionCases<deqp::gles3::Functional::CeilCase>
            (&this->super_TestCaseGroup,"ceil",true,false,false);
  addFunctionCases<deqp::gles3::Functional::FractCase>
            (&this->super_TestCaseGroup,"fract",true,false,false);
  addFunctionCases<deqp::gles3::Functional::ModfCase>
            (&this->super_TestCaseGroup,"modf",true,false,false);
  addFunctionCases<deqp::gles3::Functional::IsnanCase>
            (&this->super_TestCaseGroup,"isnan",true,false,false);
  addFunctionCases<deqp::gles3::Functional::IsinfCase>
            (&this->super_TestCaseGroup,"isinf",true,false,false);
  addFunctionCases<deqp::gles3::Functional::FloatBitsToIntCase>
            (&this->super_TestCaseGroup,"floatbitstoint",true,false,false);
  addFunctionCases<deqp::gles3::Functional::FloatBitsToUintCase>
            (&this->super_TestCaseGroup,"floatbitstouint",true,false,false);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "intbitstofloat","intBitsToFloat() Tests");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "uintbitstofloat","uintBitsToFloat() Tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  uintType = TYPE_FLOAT;
  uVar2 = extraout_RAX;
  while ((int)uintType < 4) {
    if ((int)uintType < 2) {
      local_64 = TYPE_INT;
      local_68 = TYPE_UINT;
    }
    else {
      local_64 = glu::getDataTypeIntVec(uintType);
      local_68 = glu::getDataTypeUintVec(uintType);
    }
    for (local_40 = SHADERTYPE_VERTEX; (int)local_40 < 2; local_40 = local_40 + SHADERTYPE_FRAGMENT)
    {
      pTVar1 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,local_64,local_40);
      tcu::TestNode::addChild(node,pTVar1);
      pTVar1 = (TestNode *)operator_new(0x280);
      BitsToFloatCase::BitsToFloatCase
                ((BitsToFloatCase *)pTVar1,(this->super_TestCaseGroup).m_context,local_68,local_40);
      tcu::TestNode::addChild(node_00,pTVar1);
    }
    uintType = uintType + TYPE_FLOAT;
    uVar2 = (ulong)uintType;
  }
  return (int)uVar2;
}

Assistant:

void ShaderCommonFunctionTests::init (void)
{
	//																	Float?	Int?	Uint?
	addFunctionCases<AbsCase>				(this,	"abs",				true,	true,	false);
	addFunctionCases<SignCase>				(this,	"sign",				true,	true,	false);
	addFunctionCases<FloorCase>				(this,	"floor",			true,	false,	false);
	addFunctionCases<TruncCase>				(this,	"trunc",			true,	false,	false);
	addFunctionCases<RoundCase>				(this,	"round",			true,	false,	false);
	addFunctionCases<RoundEvenCase>			(this,	"roundeven",		true,	false,	false);
	addFunctionCases<CeilCase>				(this,	"ceil",				true,	false,	false);
	addFunctionCases<FractCase>				(this,	"fract",			true,	false,	false);
	// mod
	addFunctionCases<ModfCase>				(this,	"modf",				true,	false,	false);
	// min
	// max
	// clamp
	// mix
	// step
	// smoothstep
	addFunctionCases<IsnanCase>				(this,	"isnan",			true,	false,	false);
	addFunctionCases<IsinfCase>				(this,	"isinf",			true,	false,	false);
	addFunctionCases<FloatBitsToIntCase>	(this,	"floatbitstoint",	true,	false,	false);
	addFunctionCases<FloatBitsToUintCase>	(this,	"floatbitstouint",	true,	false,	false);

	// (u)intBitsToFloat()
	{
		tcu::TestCaseGroup* intGroup	= new tcu::TestCaseGroup(m_testCtx, "intbitstofloat",	"intBitsToFloat() Tests");
		tcu::TestCaseGroup* uintGroup	= new tcu::TestCaseGroup(m_testCtx, "uintbitstofloat",	"uintBitsToFloat() Tests");

		addChild(intGroup);
		addChild(uintGroup);

		for (int vecSize = 1; vecSize < 4; vecSize++)
		{
			const glu::DataType		intType		= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::DataType		uintType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;

			for (int shaderType = glu::SHADERTYPE_VERTEX; shaderType <= glu::SHADERTYPE_FRAGMENT; shaderType++)
			{
				intGroup->addChild(new BitsToFloatCase(m_context, intType, glu::ShaderType(shaderType)));
				uintGroup->addChild(new BitsToFloatCase(m_context, uintType, glu::ShaderType(shaderType)));
			}
		}
	}
}